

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsFirstPartialDerivativeWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *partialDerivative)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  element_type *peVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  ulong in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *cost;
  iterator __end2;
  iterator __begin2;
  CostsMap *__range2;
  bool first;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffb08;
  double *in_stack_fffffffffffffb10;
  TimeRange *in_stack_fffffffffffffb18;
  VectorDynSize *in_stack_fffffffffffffb28;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffb30;
  StorageBaseType *in_stack_fffffffffffffb50;
  double *in_stack_fffffffffffffb58;
  string local_398 [32];
  ostringstream local_378 [376];
  string local_200 [48];
  ostringstream local_1d0 [376];
  reference local_58;
  _Self local_50;
  _Self local_48;
  long local_40;
  byte local_31;
  ulong local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  lVar3 = iDynTree::VectorDynSize::size();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 != lVar4) {
    iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::resize(local_30);
  }
  local_31 = 1;
  local_40 = *in_RDI + 0x58;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                *)in_stack_fffffffffffffb08);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
              *)in_stack_fffffffffffffb08);
  do {
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) {
      local_1 = 1;
LAB_002fe0ae:
      return (bool)(local_1 & 1);
    }
    local_58 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                            *)0x2fdc71);
    bVar1 = TimeRange::isInRange(in_stack_fffffffffffffb18,(double)in_stack_fffffffffffffb10);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2fdcb4);
      uVar2 = (*peVar5->_vptr_Cost[4])
                        (local_18,peVar5,local_20,local_28,&(local_58->second).controlJacobianBuffer
                        );
      if ((uVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar6 = std::operator<<((ostream *)local_1d0,"Error while evaluating cost ");
        peVar5 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2fdd2c);
        psVar7 = Cost::name_abi_cxx11_(peVar5);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::operator<<(poVar6,".");
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("OptimalControlProblem","costFirstPartialDerivativeWRTControl",pcVar8)
        ;
        std::__cxx11::string::~string(local_200);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        goto LAB_002fe0ae;
      }
      lVar3 = iDynTree::VectorDynSize::size();
      lVar4 = iDynTree::VectorDynSize::size();
      if (lVar3 != lVar4) {
        std::__cxx11::ostringstream::ostringstream(local_378);
        poVar6 = std::operator<<((ostream *)local_378,"Error while evaluating ");
        peVar5 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2fde86);
        psVar7 = Cost::name_abi_cxx11_(peVar5);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        poVar6 = std::operator<<(poVar6,": ");
        std::operator<<(poVar6,"the jacobian size is expected to match the control dimension.");
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("OptimalControlProblem","costFirstPartialDerivativeWRTControl",pcVar8)
        ;
        std::__cxx11::string::~string(local_398);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_378);
        goto LAB_002fe0ae;
      }
      if ((local_31 & 1) == 0) {
        in_stack_fffffffffffffb10 = &(local_58->second).weight;
        toEigen(in_stack_fffffffffffffb28);
        Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        toEigen(in_stack_fffffffffffffb28);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
        operator+=(in_stack_fffffffffffffb30,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)in_stack_fffffffffffffb28);
      }
      else {
        in_stack_fffffffffffffb18 = (TimeRange *)&(local_58->second).weight;
        toEigen(in_stack_fffffffffffffb28);
        Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        toEigen(in_stack_fffffffffffffb28);
        Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        local_31 = 0;
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                  *)in_stack_fffffffffffffb10);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsFirstPartialDerivativeWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &partialDerivative)
        {
            if (partialDerivative.size() != control.size()) {
                partialDerivative.resize(control.size());
            }

            bool first = true;

            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if (!cost.second.cost->costFirstPartialDerivativeWRTControl(time, state, control, cost.second.controlJacobianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (cost.second.controlJacobianBuffer.size() != control.size()){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the jacobian size is expected to match the control dimension.";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                    }
                }
            }
            return true;
        }